

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O0

void __thiscall RVO::RVOSimulator::doStep(RVOSimulator *this)

{
  size_type sVar1;
  reference ppAVar2;
  int local_18;
  int local_14;
  int i_1;
  int i;
  RVOSimulator *this_local;
  
  KdTree::buildAgentTree(this->kdTree_);
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
    if ((int)sVar1 <= local_14) break;
    ppAVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                        (&this->agents_,(long)local_14);
    Agent::computeNeighbors(*ppAVar2);
    ppAVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                        (&this->agents_,(long)local_14);
    Agent::computeNewVelocity(*ppAVar2);
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
    if ((int)sVar1 <= local_18) break;
    ppAVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                        (&this->agents_,(long)local_18);
    Agent::update(*ppAVar2);
    local_18 = local_18 + 1;
  }
  this->globalTime_ = this->timeStep_ + this->globalTime_;
  return;
}

Assistant:

void RVOSimulator::doStep()
	{
		kdTree_->buildAgentTree();

#ifdef _OPENMP
#pragma omp parallel for
#endif
		for (int i = 0; i < static_cast<int>(agents_.size()); ++i) {
			agents_[i]->computeNeighbors();
			agents_[i]->computeNewVelocity();
		}

#ifdef _OPENMP
#pragma omp parallel for
#endif
		for (int i = 0; i < static_cast<int>(agents_.size()); ++i) {
			agents_[i]->update();
		}

		globalTime_ += timeStep_;
	}